

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

char * mp_get_hex_internal(mp_int *x,uint8_t letter_offset)

{
  char *buf;
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  
  lVar3 = x->nw * 0x10;
  bVar5 = 0;
  buf = (char *)safemalloc(lVar3 + 1U,1,0);
  buf[lVar3] = '\0';
  uVar1 = 0;
  lVar2 = lVar3;
  while (lVar2 != 0) {
    bVar4 = (byte)(x->w[uVar1 >> 4] >> (bVar5 & 0x3c)) & 0xf;
    buf[lVar2 + -1] = (-((byte)(bVar4 + 6) >> 4) & letter_offset) + bVar4 + '0';
    uVar1 = uVar1 + 1;
    bVar5 = bVar5 + 4;
    lVar2 = lVar2 + -1;
  }
  trim_leading_zeroes(buf,lVar3 + 1U,lVar3 - 1);
  return buf;
}

Assistant:

static char *mp_get_hex_internal(mp_int *x, uint8_t letter_offset)
{
    size_t nibbles = x->nw * BIGNUM_INT_BYTES * 2;
    size_t bufsize = nibbles + 1;
    char *outbuf = snewn(bufsize, char);
    outbuf[nibbles] = '\0';

    for (size_t nibble = 0; nibble < nibbles; nibble++) {
        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        uint8_t digitval = 0xF & (x->w[word_idx] >> (nibble_within_word * 4));

        uint8_t mask = -((digitval + 6) >> 4);
        char digit = digitval + '0' + (letter_offset & mask);
        outbuf[nibbles-1 - nibble] = digit;
    }

    trim_leading_zeroes(outbuf, bufsize, nibbles - 1);
    return outbuf;
}